

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsnames.c
# Opt level: O1

FT_Error FT_Get_Sfnt_LangTag(FT_Face face,FT_UInt langID,FT_SfntLangTag *alangTag)

{
  ushort *puVar1;
  FT_Memory pFVar2;
  FT_Stream stream;
  FT_Error FVar3;
  void *__s;
  unsigned_long uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((face == (FT_Face)0x0 || alangTag == (FT_SfntLangTag *)0x0) || ((face->face_flags & 8) == 0))
  {
    return 6;
  }
  if ((short)face[2].num_charmaps != 1) {
    return 8;
  }
  if (langID < 0x8001) {
    return 6;
  }
  if (*(uint *)&face[2].generic.finalizer <= langID - 0x8000) {
    return 6;
  }
  puVar1 = (ushort *)(face[2].bbox.xMin + (ulong)(langID - 0x8000) * 0x18);
  uVar5 = (ulong)*puVar1;
  if ((uVar5 != 0) && (*(long *)(puVar1 + 8) == 0)) {
    pFVar2 = face->memory;
    stream = face->stream;
    __s = (*pFVar2->alloc)(pFVar2,uVar5);
    if (__s == (void *)0x0) {
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
    }
    else {
      memset(__s,0,uVar5);
      *(void **)(puVar1 + 8) = __s;
      uVar5 = *(ulong *)(puVar1 + 4);
      if (stream->read == (FT_Stream_IoFunc)0x0) {
        bVar6 = uVar5 <= stream->size;
      }
      else {
        uVar4 = (*stream->read)(stream,uVar5,(uchar *)0x0,0);
        bVar6 = uVar4 == 0;
      }
      if (bVar6) {
        stream->pos = uVar5;
        FVar3 = FT_Stream_Read(stream,*(FT_Byte **)(puVar1 + 8),(ulong)*puVar1);
        if (FVar3 == 0) goto LAB_00138225;
      }
    }
    if (*(void **)(puVar1 + 8) != (void *)0x0) {
      (*pFVar2->free)(pFVar2,*(void **)(puVar1 + 8));
    }
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    *puVar1 = 0;
  }
LAB_00138225:
  alangTag->string = *(FT_Byte **)(puVar1 + 8);
  alangTag->string_len = (uint)*puVar1;
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_Sfnt_LangTag( FT_Face          face,
                       FT_UInt          langID,
                       FT_SfntLangTag  *alangTag )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );


    if ( alangTag && face && FT_IS_SFNT( face ) )
    {
      TT_Face  ttface = (TT_Face)face;


      if ( ttface->name_table.format != 1 )
        return FT_THROW( Invalid_Table );

      if ( langID > 0x8000U                                        &&
           langID - 0x8000U < ttface->name_table.numLangTagRecords )
      {
        TT_LangTag  entry = ttface->name_table.langTags +
                            ( langID - 0x8000U );


        /* load name on demand */
        if ( entry->stringLength > 0 && !entry->string )
        {
          FT_Memory  memory = face->memory;
          FT_Stream  stream = face->stream;


          if ( FT_NEW_ARRAY  ( entry->string, entry->stringLength ) ||
               FT_STREAM_SEEK( entry->stringOffset )                ||
               FT_STREAM_READ( entry->string, entry->stringLength ) )
          {
            FT_FREE( entry->string );
            entry->stringLength = 0;
          }
        }

        alangTag->string     = (FT_Byte*)entry->string;
        alangTag->string_len = entry->stringLength;

        error = FT_Err_Ok;
      }
    }

    return error;
  }